

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O0

string * __thiscall duckdb::StructFilter::ToString(StructFilter *this,string *column_name)

{
  ulong uVar1;
  pointer pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [56];
  
  __lhs_00 = in_RDI;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pTVar2 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                         *)in_stack_fffffffffffffec0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                     (char *)in_RDI);
    ::std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    (*pTVar2->_vptr_TableFilter[3])(in_RDI,pTVar2,local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::__cxx11::string::~string(local_58);
  }
  else {
    pTVar2 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                         *)in_stack_fffffffffffffec0);
    __lhs = &local_e8;
    ::std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    ::std::operator+(__lhs,(char *)pTVar2);
    ::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffef8);
    ::std::operator+(in_stack_fffffffffffffef8,in_RSI);
    ::std::operator+(__lhs,(char *)pTVar2);
    (*pTVar2->_vptr_TableFilter[3])(in_RDI,pTVar2,local_88);
    ::std::__cxx11::string::~string(local_88);
    ::std::__cxx11::string::~string(local_a8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    ::std::__cxx11::string::~string(local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  return __lhs_00;
}

Assistant:

string StructFilter::ToString(const string &column_name) const {
	if (!child_name.empty()) {
		return child_filter->ToString(column_name + "." + child_name);
	}
	return child_filter->ToString("struct_extract_at(" + column_name + "," + std::to_string(child_idx + 1) + ")");
}